

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::X
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,
          TPZVec<double> *coordinate,TPZVec<double> *result)

{
  TPZFNMatrix<54,_double> cornerco;
  int64_t in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZFNMatrix<54,_double> *in_stack_fffffffffffffda0;
  TPZVec<double> *in_stack_fffffffffffffe88;
  TPZVec<double> *in_stack_fffffffffffffe90;
  TPZFMatrix<double> *in_stack_fffffffffffffe98;
  TPZQuadSphere<pzgeom::TPZGeoQuad> *in_stack_fffffffffffffea0;
  
  TPZFNMatrix<54,_double>::TPZFNMatrix
            (in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90)
  ;
  CornerCoordinates((TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *)
                    in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::X<double>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
  TPZFNMatrix<54,_double>::~TPZFNMatrix((TPZFNMatrix<54,_double> *)0x17b9595);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::X(TPZVec<REAL> &coordinate,TPZVec<REAL> &result) const {
#ifdef PZDEBUG
    if(result.size() != 3) DebugStop();
#endif
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
	fGeo.X(cornerco,coordinate,result);
}